

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_rsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  RSA *rsactx;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  EVP_MD_CTX *ctx;
  size_t *local_50;
  uchar hash [20];
  
  rsactx = (RSA *)*abstract;
  local_50 = signature_len;
  _libssh2_sha1_init(&ctx);
  uVar2 = 0;
  uVar3 = (ulong)(uint)veccount;
  if (veccount < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
    EVP_DigestUpdate((EVP_MD_CTX *)ctx,*(void **)((long)&datavec->iov_base + uVar2),
                     *(size_t *)((long)&datavec->iov_len + uVar2));
  }
  EVP_DigestFinal((EVP_MD_CTX *)ctx,hash,(uint *)0x0);
  EVP_MD_CTX_free(ctx);
  iVar1 = _libssh2_rsa_sha1_sign(session,rsactx,hash,0x14,signature,local_50);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int
hostkey_method_ssh_rsa_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);

#ifdef _libssh2_rsa_sha1_signv
    return _libssh2_rsa_sha1_signv(session, signature, signature_len,
                                   veccount, datavec, rsactx);
#else
    int ret;
    int i;
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;

    (void)libssh2_sha1_init(&ctx);
    for(i = 0; i < veccount; i++) {
        libssh2_sha1_update(ctx, datavec[i].iov_base, datavec[i].iov_len);
    }
    libssh2_sha1_final(ctx, hash);

    ret = _libssh2_rsa_sha1_sign(session, rsactx, hash, SHA_DIGEST_LENGTH,
                                 signature, signature_len);
    if(ret) {
        return -1;
    }

    return 0;
#endif
}